

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::childEvent(QMdiSubWindow *this,QChildEvent *childEvent)

{
  QSizeGrip *newSizeGrip;
  
  if (*(short *)(childEvent + 8) == 0x45) {
    newSizeGrip = (QSizeGrip *)QMetaObject::cast((QObject *)&QSizeGrip::staticMetaObject);
    if (newSizeGrip != (QSizeGrip *)0x0) {
      QMdiSubWindowPrivate::setSizeGrip
                (*(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8,newSizeGrip);
      return;
    }
  }
  return;
}

Assistant:

void QMdiSubWindow::childEvent(QChildEvent *childEvent)
{
    if (childEvent->type() != QEvent::ChildPolished)
        return;
#if QT_CONFIG(sizegrip)
    if (QSizeGrip *sizeGrip = qobject_cast<QSizeGrip *>(childEvent->child()))
        d_func()->setSizeGrip(sizeGrip);
#endif
}